

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

AssertionExpr *
slang::ast::DisableIffAssertionExpr::fromSyntax
          (DisableIffSyntax *syntax,AssertionExpr *expr,ASTContext *context)

{
  Compilation *this;
  Expression *this_00;
  DisableIffAssertionExpr *pDVar1;
  SourceRange sourceRange;
  SampledValueExprVisitor local_40;
  
  this = ((context->scope).ptr)->compilation;
  this_00 = bindExpr((syntax->expr).ptr,context,false,true);
  local_40.isFutureGlobal = false;
  local_40.localVarCode.subsystem = Statements;
  local_40.localVarCode.code = 0x15;
  local_40.matchedCode.subsystem = Statements;
  local_40.matchedCode.code = 0x16;
  local_40.context = context;
  Expression::visitExpression<slang::ast::Expression_const,slang::ast::SampledValueExprVisitor&>
            (this_00,this_00,&local_40);
  if ((context->assertionInstance != (AssertionInstanceDetails *)0x0) &&
     (context->assertionInstance->isRecursive == true)) {
    sourceRange = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
    ASTContext::addDiag(context,(DiagCode)0x3d0008,sourceRange);
  }
  pDVar1 = BumpAllocator::
           emplace<slang::ast::DisableIffAssertionExpr,slang::ast::Expression_const&,slang::ast::AssertionExpr_const&>
                     (&this->super_BumpAllocator,this_00,expr);
  return &pDVar1->super_AssertionExpr;
}

Assistant:

AssertionExpr& DisableIffAssertionExpr::fromSyntax(const DisableIffSyntax& syntax,
                                                   const AssertionExpr& expr,
                                                   const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& cond = bindExpr(*syntax.expr, context);

    checkSampledValueExpr(cond, context, false, diag::DisableIffLocalVar, diag::DisableIffMatched);

    if (context.assertionInstance && context.assertionInstance->isRecursive)
        context.addDiag(diag::RecursivePropDisableIff, syntax.sourceRange());

    return *comp.emplace<DisableIffAssertionExpr>(cond, expr);
}